

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O2

bool __thiscall Xml::Private::parse(Private *this,char *data,Element *element)

{
  bool bVar1;
  char *pcVar2;
  Position startPos;
  String local_60;
  Position local_38;
  
  (this->pos).line = 1;
  (this->pos).lineStart = data;
  (this->pos).pos = data;
  skipSpace(this);
  while ((pcVar2 = (this->pos).pos, *pcVar2 == '<' && (pcVar2[1] == '?'))) {
    local_38.lineStart = (this->pos).lineStart;
    local_38.line = (this->pos).line;
    local_38._4_4_ = *(undefined4 *)&(this->pos).field_0x4;
    local_38.pos = (this->pos).pos;
    pcVar2 = pcVar2 + 2;
    (this->pos).pos = pcVar2;
    while( true ) {
      pcVar2 = String::findOneOf(pcVar2,"\r\n?");
      if (pcVar2 == (char *)0x0) {
        local_60.data = &local_60._data;
        local_60._data.ref = 0;
        local_60._data.str = "Unexpected end of file";
        local_60._data.len = 0x16;
        syntaxError(this,&local_38,&local_60);
        goto LAB_0010742b;
      }
      if ((*pcVar2 == '?') && (pcVar2[1] == '>')) break;
      (this->pos).pos = pcVar2 + 1;
      skipSpace(this);
      pcVar2 = (this->pos).pos;
    }
    (this->pos).pos = pcVar2 + 2;
    skipSpace(this);
  }
  bVar1 = readToken(this);
  if (bVar1) {
    if ((this->token).type == startTagBeginType) {
      bVar1 = parseElement(this,element);
      return bVar1;
    }
    local_60.data = &local_60._data;
    local_60._data.ref = 0;
    local_60._data.str = "Expected \'<\'";
    local_60._data.len = 0xc;
    syntaxError(this,&(this->token).pos,&local_60);
LAB_0010742b:
    String::~String(&local_60);
  }
  return false;
}

Assistant:

bool Xml::Private::parse(const char* data, Element& element)
{
  pos.line = 1;
  pos.pos = pos.lineStart = data;

  skipSpace();
  while(*pos.pos == '<' && pos.pos[1] == '?')
  {
    Position startPos = pos;
    pos.pos += 2;
    for(;;)
    {
      const char* end = String::findOneOf(pos.pos, "\r\n?");
      if(!end)
        return this->syntaxError(startPos, "Unexpected end of file"), false;
      if(*end == '?' && end[1] == '>')
      {
        pos.pos = end + 2;
        break;
      }
      pos.pos = end + 1;
      skipSpace();
    }
    skipSpace();
  }
  if(!readToken())
    return false;
  if(token.type != Token::startTagBeginType)
    return syntaxError(token.pos, "Expected '<'"), false;
  return parseElement(element);
}